

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void Cmd_sizeup(FCommandLine *argv,APlayerPawn *who,int key)

{
  UCVarValue value;
  FSoundID local_4;
  
  value._0_4_ = screenblocks.Value + 1;
  value._4_4_ = 0;
  FBaseCVar::SetGenericRep(&screenblocks.super_FBaseCVar,value,CVAR_Int);
  S_FindSound("menu/change");
  S_Sound(0x22,&local_4,snd_menuvolume.Value,0.0);
  return;
}

Assistant:

CCMD (sizeup)
{
	screenblocks = screenblocks + 1;
	S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
}